

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

SUNErrCode
N_VLinearSumVectorArray_Serial
          (int nvec,sunrealtype a,N_Vector *X,sunrealtype b,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  N_Vector *pp_Var7;
  long lVar8;
  N_Vector *pp_Var9;
  ulong uVar10;
  sunrealtype a_00;
  
  if (nvec == 1) {
    N_VLinearSum_Serial(a,*X,b,*Y,*Z);
  }
  else {
    pp_Var7 = Y;
    pp_Var9 = X;
    a_00 = a;
    if ((Z == Y && b == 1.0) || (pp_Var7 = X, pp_Var9 = Y, a_00 = b, Z == X && a == 1.0)) {
      VaxpyVectorArray_Serial(nvec,a_00,pp_Var9,pp_Var7);
    }
    else if ((a != 1.0) || (((NAN(a) || (b != 1.0)) || (NAN(b))))) {
      if (((((a == 1.0) && (!NAN(a))) && (b == -1.0)) && (pp_Var7 = Y, pp_Var9 = X, !NAN(b))) ||
         (((a == -1.0 && (!NAN(a))) && ((b == 1.0 && (pp_Var7 = X, pp_Var9 = Y, !NAN(b))))))) {
        if (0 < nvec) {
          lVar1 = *(*pp_Var9)->content;
          uVar10 = 0;
          do {
            if (0 < lVar1) {
              lVar2 = *(long *)((long)pp_Var9[uVar10]->content + 0x10);
              lVar3 = *(long *)((long)pp_Var7[uVar10]->content + 0x10);
              lVar4 = *(long *)((long)Z[uVar10]->content + 0x10);
              lVar8 = 0;
              do {
                *(double *)(lVar4 + lVar8 * 8) =
                     *(double *)(lVar2 + lVar8 * 8) - *(double *)(lVar3 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar1 != lVar8);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != (uint)nvec);
        }
      }
      else if (((a == 1.0) && (!NAN(a))) || ((b == 1.0 && (!NAN(b))))) {
        bVar5 = NAN(a);
        bVar6 = a == 1.0;
        if ((bVar6) && (!bVar5)) {
          a = b;
        }
        pp_Var7 = Y;
        if (!bVar6) {
          pp_Var7 = X;
        }
        if (bVar5) {
          pp_Var7 = X;
        }
        if (!bVar6) {
          X = Y;
        }
        if (bVar5) {
          X = Y;
        }
        VLin1VectorArray_Serial(nvec,a,pp_Var7,X,Z);
      }
      else if (((a == -1.0) && (!NAN(a))) || ((b == -1.0 && (!NAN(b))))) {
        bVar5 = NAN(a);
        bVar6 = a == -1.0;
        if ((bVar6) && (!bVar5)) {
          a = b;
        }
        pp_Var7 = Y;
        if (!bVar6) {
          pp_Var7 = X;
        }
        if (bVar5) {
          pp_Var7 = X;
        }
        if (!bVar6) {
          X = Y;
        }
        if (bVar5) {
          X = Y;
        }
        VLin2VectorArray_Serial(nvec,a,pp_Var7,X,Z);
      }
      else if ((a != b) || (NAN(a) || NAN(b))) {
        if ((-b != a) || (NAN(-b) || NAN(a))) {
          if (0 < nvec) {
            lVar1 = *(*Z)->content;
            uVar10 = 0;
            do {
              if (0 < lVar1) {
                lVar2 = *(long *)((long)X[uVar10]->content + 0x10);
                lVar3 = *(long *)((long)Y[uVar10]->content + 0x10);
                lVar4 = *(long *)((long)Z[uVar10]->content + 0x10);
                lVar8 = 0;
                do {
                  *(double *)(lVar4 + lVar8 * 8) =
                       *(double *)(lVar2 + lVar8 * 8) * a + *(double *)(lVar3 + lVar8 * 8) * b;
                  lVar8 = lVar8 + 1;
                } while (lVar1 != lVar8);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != (uint)nvec);
          }
        }
        else {
          VScaleDiffVectorArray_Serial(nvec,a,X,Y,Z);
        }
      }
      else {
        VScaleSumVectorArray_Serial(nvec,a,X,Y,Z);
      }
    }
    else if (0 < nvec) {
      lVar1 = *(*X)->content;
      uVar10 = 0;
      do {
        if (0 < lVar1) {
          lVar2 = *(long *)((long)X[uVar10]->content + 0x10);
          lVar3 = *(long *)((long)Y[uVar10]->content + 0x10);
          lVar4 = *(long *)((long)Z[uVar10]->content + 0x10);
          lVar8 = 0;
          do {
            *(double *)(lVar4 + lVar8 * 8) =
                 *(double *)(lVar2 + lVar8 * 8) + *(double *)(lVar3 + lVar8 * 8);
            lVar8 = lVar8 + 1;
          } while (lVar1 != lVar8);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)nvec);
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearSumVectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                          sunrealtype b, N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);

  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;
  sunrealtype c;
  N_Vector* V1;
  N_Vector* V2;
  sunbooleantype test;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VLinearSum */
  if (nvec == 1)
  {
    N_VLinearSum_Serial(a, X[0], b, Y[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* BLAS usage: axpy y <- ax+y */
  if ((b == ONE) && (Z == Y))
  {
    VaxpyVectorArray_Serial(nvec, a, X, Y);
    return SUN_SUCCESS;
  }

  /* BLAS usage: axpy x <- by+x */
  if ((a == ONE) && (Z == X))
  {
    VaxpyVectorArray_Serial(nvec, b, Y, X);
    return SUN_SUCCESS;
  }

  /* Case: a == b == 1.0 */
  if ((a == ONE) && (b == ONE))
  {
    VSumVectorArray_Serial(nvec, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                    */
  /*   (1) a == 1.0, b = -1.0, */
  /*   (2) a == -1.0, b == 1.0 */
  if ((test = ((a == ONE) && (b == -ONE))) || ((a == -ONE) && (b == ONE)))
  {
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VDiffVectorArray_Serial(nvec, V2, V1, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                                                  */
  /*   (1) a == 1.0, b == other or 0.0,                      */
  /*   (2) a == other or 0.0, b == 1.0                       */
  /* if a or b is 0.0, then user should have called N_VScale */
  if ((test = (a == ONE)) || (b == ONE))
  {
    c  = test ? b : a;
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VLin1VectorArray_Serial(nvec, c, V1, V2, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                     */
  /*   (1) a == -1.0, b != 1.0, */
  /*   (2) a != 1.0, b == -1.0  */
  if ((test = (a == -ONE)) || (b == -ONE))
  {
    c  = test ? b : a;
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VLin2VectorArray_Serial(nvec, c, V1, V2, Z);
    return SUN_SUCCESS;
  }

  /* Case: a == b                                                         */
  /* catches case both a and b are 0.0 - user should have called N_VConst */
  if (a == b)
  {
    VScaleSumVectorArray_Serial(nvec, a, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Case: a == -b */
  if (a == -b)
  {
    VScaleDiffVectorArray_Serial(nvec, a, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Do all cases not handled above:                               */
  /*   (1) a == other, b == 0.0 - user should have called N_VScale */
  /*   (2) a == 0.0, b == other - user should have called N_VScale */
  /*   (3) a,b == other, a !=b, a != -b                            */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* compute linear sum for each vector pair in vector arrays */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = a * xd[j] + b * yd[j]; }
  }

  return SUN_SUCCESS;
}